

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O3

int SM3_final_noclear(SM3_CTX *ctx,uint8_t *digest)

{
  _func_void_uint32_t_ptr_uint8_t_ptr_int *p_Var1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  uint32_t tdigest [8];
  uint8_t block [64];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint8_t local_68 [56];
  uint32_t local_30;
  uint32_t local_2c;
  
  p_Var1 = sm3_compress_impl;
  iVar3 = 0;
  if (digest != (uint8_t *)0x0) {
    iVar3 = 0;
    if ((ctx != (SM3_CTX *)0x0) &&
       (iVar3 = 0, sm3_compress_impl != (_func_void_uint32_t_ptr_uint8_t_ptr_int *)0x0)) {
      local_88 = *(undefined8 *)ctx->digest;
      uStack_80 = *(undefined8 *)(ctx->digest + 2);
      local_78 = *(undefined8 *)(ctx->digest + 4);
      uStack_70 = *(undefined8 *)(ctx->digest + 6);
      iVar3 = ctx->num;
      __n = (size_t)iVar3;
      memcpy(local_68,ctx->block,__n);
      local_68[__n] = 0x80;
      if ((long)__n < 0x38) {
        memset(local_68 + __n + 1,0,(long)(0x37 - iVar3));
      }
      else {
        memset(local_68 + __n + 1,0,0x3f - __n);
        (*p_Var1)((uint32_t *)&local_88,local_68,1);
        local_68[0x20] = '\0';
        local_68[0x21] = '\0';
        local_68[0x22] = '\0';
        local_68[0x23] = '\0';
        local_68[0x24] = '\0';
        local_68[0x25] = '\0';
        local_68[0x26] = '\0';
        local_68[0x27] = '\0';
        local_68[0x28] = '\0';
        local_68[0x29] = '\0';
        local_68[0x2a] = '\0';
        local_68[0x2b] = '\0';
        local_68[0x2c] = '\0';
        local_68[0x2d] = '\0';
        local_68[0x2e] = '\0';
        local_68[0x2f] = '\0';
        local_68[0x10] = '\0';
        local_68[0x11] = '\0';
        local_68[0x12] = '\0';
        local_68[0x13] = '\0';
        local_68[0x14] = '\0';
        local_68[0x15] = '\0';
        local_68[0x16] = '\0';
        local_68[0x17] = '\0';
        local_68[0x18] = '\0';
        local_68[0x19] = '\0';
        local_68[0x1a] = '\0';
        local_68[0x1b] = '\0';
        local_68[0x1c] = '\0';
        local_68[0x1d] = '\0';
        local_68[0x1e] = '\0';
        local_68[0x1f] = '\0';
        local_68[0] = '\0';
        local_68[1] = '\0';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68[0xc] = '\0';
        local_68[0xd] = '\0';
        local_68[0xe] = '\0';
        local_68[0xf] = '\0';
        local_68[0x30] = '\0';
        local_68[0x31] = '\0';
        local_68[0x32] = '\0';
        local_68[0x33] = '\0';
        local_68[0x34] = '\0';
        local_68[0x35] = '\0';
        local_68[0x36] = '\0';
        local_68[0x37] = '\0';
      }
      local_30 = to_be32(ctx->nblocks >> 0x17);
      local_2c = to_be32(ctx->nblocks * 0x200 + iVar3 * 8);
      (*sm3_compress_impl)((uint32_t *)&local_88,local_68,1);
      lVar4 = 0;
      do {
        uVar2 = to_be32(*(uint32_t *)((long)&local_88 + lVar4 * 4));
        *(uint32_t *)(digest + lVar4 * 4) = uVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      CRYPTO_memzero(&local_88,0x20);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int SM3_final_noclear(SM3_CTX *ctx, uint8_t *digest)
{
    if (sm3_compress_impl == NULL || ctx == NULL || digest == NULL)
        return GML_ERROR;

    int i;
    int num;
    uint32_t *pdigest = (uint32_t*)digest;
    uint32_t tdigest[8];
    uint8_t block[SM3_BLOCK_SIZE];
    uint32_t *count = (uint32_t*)(block + SM3_BLOCK_SIZE - 8);

    tdigest[0] = ctx->digest[0];
    tdigest[1] = ctx->digest[1];
    tdigest[2] = ctx->digest[2];
    tdigest[3] = ctx->digest[3];
    tdigest[4] = ctx->digest[4];
    tdigest[5] = ctx->digest[5];
    tdigest[6] = ctx->digest[6];
    tdigest[7] = ctx->digest[7];
    num = ctx->num;
    memcpy(block, ctx->block, num);
    block[num] = 0x80U;

    if (num + 9 <= SM3_BLOCK_SIZE) 
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 9);
    else {
        memset(block + num + 1, 0, SM3_BLOCK_SIZE - num - 1);
        sm3_compress_impl(tdigest, block, 1);
        memset(block, 0, SM3_BLOCK_SIZE - 8);
    }

    count[0] = to_be32((ctx->nblocks) >> 23);
    count[1] = to_be32((ctx->nblocks << 9) + (num << 3));

    sm3_compress_impl(tdigest, block, 1);
    for (i = 0; i < sizeof(tdigest)/sizeof(tdigest[0]); i++) 
        pdigest[i] = to_be32(tdigest[i]);

    CRYPTO_memzero(tdigest, SM3_DIGEST_LENGTH);
    return GML_OK;
}